

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O0

void __thiscall
FIX50SP2::MessageCracker::onMessage
          (MessageCracker *this,TradeAggregationReport *param_1,SessionID *param_2)

{
  UnsupportedMessageType *this_00;
  allocator<char> local_41;
  string local_40;
  SessionID *local_20;
  SessionID *param_2_local;
  TradeAggregationReport *param_1_local;
  MessageCracker *this_local;
  
  local_20 = param_2;
  param_2_local = (SessionID *)param_1;
  param_1_local = (TradeAggregationReport *)this;
  this_00 = (UnsupportedMessageType *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  FIX::UnsupportedMessageType::UnsupportedMessageType(this_00,&local_40);
  __cxa_throw(this_00,&FIX::UnsupportedMessageType::typeinfo,
              FIX::UnsupportedMessageType::~UnsupportedMessageType);
}

Assistant:

virtual void onMessage( const PayManagementReport&, const FIX::SessionID& ) 
    { throw FIX::UnsupportedMessageType(); }